

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void update_disp(void)

{
  int iVar1;
  int n;
  long lVar2;
  missile *pmVar3;
  int n_00;
  long lVar4;
  missile (*pamVar5) [2];
  
  pamVar5 = missiles;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    n = (int)lVar2;
    if (robots[lVar2].status != 0) {
      plot_robot(n);
      robot_stat(n);
    }
    lVar4 = 0;
    pmVar3 = *pamVar5;
    for (; lVar4 != 2; lVar4 = lVar4 + 1) {
      iVar1 = ((missile *)&pmVar3->stat)->stat;
      n_00 = (int)lVar4;
      if (iVar1 == 2) {
        plot_exp(n,n_00);
        count_miss(n,n_00);
      }
      else if (iVar1 == 1) {
        plot_miss(n,n_00);
      }
      pmVar3 = pmVar3 + 1;
    }
    pamVar5 = (missile (*) [2])((long)pamVar5 + 0x58);
  }
  return;
}

Assistant:

void update_disp()
{
   int i, j;

  /* plot each live robot and update status */
  for (i = 0; i < MAXROBOTS; i++) {
    if (robots[i].status != DEAD) {
      plot_robot(i);
      robot_stat(i);
    }
    /* plot each missile */
    for (j = 0; j < MIS_ROBOT; j++) {
      switch (missiles[i][j].stat) {
	case AVAIL:
	  break;
	case FLYING:
	  plot_miss(i,j);
	  break;
	case EXPLODING:
	  plot_exp(i,j);
	  count_miss(i,j);
	  break;
	default:
	  break;
      }
    }
  }
}